

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O2

void __thiscall cmGlobalNinjaGenerator::AddMacOSXContentRule(cmGlobalNinjaGenerator *this)

{
  cmNinjaRule rule;
  string local_1f8;
  string local_1d8;
  cmAlphaNum local_1b8;
  string local_188;
  undefined1 local_168 [64];
  char local_128 [32];
  char local_108 [200];
  cmAlphaNum local_40;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_188,"COPY_OSX_CONTENT",(allocator<char> *)&local_1b8);
  cmNinjaRule::cmNinjaRule((cmNinjaRule *)local_168,&local_188);
  std::__cxx11::string::~string((string *)&local_188);
  CMakeCmd_abi_cxx11_(&local_1f8,this);
  local_1b8.View_._M_len = local_1f8._M_string_length;
  local_1b8.View_._M_str = local_1f8._M_dataplus._M_p;
  local_40.View_._M_len = 0x11;
  local_40.View_._M_str = " -E copy $in $out";
  cmStrCat<>(&local_1d8,&local_1b8,&local_40);
  std::__cxx11::string::operator=((string *)(local_168 + 0x20),(string *)&local_1d8);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::__cxx11::string::assign(local_128);
  std::__cxx11::string::assign(local_108);
  AddRule(this,(cmNinjaRule *)local_168);
  cmNinjaRule::~cmNinjaRule((cmNinjaRule *)local_168);
  return;
}

Assistant:

void cmGlobalNinjaGenerator::AddMacOSXContentRule()
{
  cmNinjaRule rule("COPY_OSX_CONTENT");
  rule.Command = cmStrCat(this->CMakeCmd(), " -E copy $in $out");
  rule.Description = "Copying OS X Content $out";
  rule.Comment = "Rule for copying OS X bundle content file.";
  this->AddRule(rule);
}